

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

bool duckdb::Date::IsValid(int32_t year,int32_t month,int32_t day)

{
  undefined1 *puVar1;
  bool bVar2;
  bool bVar3;
  
  if (0 < day && 0xfffffff3 < month - 0xdU) {
    if (year < -0x59af88) {
      if ((uint)month < 6 || year != -0x59af89) {
        return false;
      }
      bVar3 = month == 6;
      bVar2 = (uint)day < 0x19;
    }
    else {
      if (year < 0x59beec) goto LAB_00285ae6;
      if (7 < (uint)month || year != 0x59beec) {
        return false;
      }
      bVar3 = month == 7;
      bVar2 = 10 < (uint)day;
    }
    if (!(bool)(bVar3 & bVar2)) {
LAB_00285ae6:
      bVar3 = IsLeapYear(year);
      if (bVar3) {
        puVar1 = LEAP_DAYS;
      }
      else {
        puVar1 = NORMAL_DAYS;
      }
      return day <= *(int *)(puVar1 + (ulong)(uint)month * 4);
    }
  }
  return false;
}

Assistant:

bool Date::IsValid(int32_t year, int32_t month, int32_t day) {
	if (month < 1 || month > 12) {
		return false;
	}
	if (day < 1) {
		return false;
	}
	if (year <= DATE_MIN_YEAR) {
		if (year < DATE_MIN_YEAR) {
			return false;
		} else if (year == DATE_MIN_YEAR) {
			if (month < DATE_MIN_MONTH || (month == DATE_MIN_MONTH && day < DATE_MIN_DAY)) {
				return false;
			}
		}
	}
	if (year >= DATE_MAX_YEAR) {
		if (year > DATE_MAX_YEAR) {
			return false;
		} else if (year == DATE_MAX_YEAR) {
			if (month > DATE_MAX_MONTH || (month == DATE_MAX_MONTH && day > DATE_MAX_DAY)) {
				return false;
			}
		}
	}
	return Date::IsLeapYear(year) ? day <= Date::LEAP_DAYS[month] : day <= Date::NORMAL_DAYS[month];
}